

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

bool anon_unknown.dwarf_29391b::WindowsImplX11Impl::ewmhSupported(void)

{
  long lVar1;
  long lVar2;
  int iVar3;
  Atom AVar4;
  Atom AVar5;
  Display *display;
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  allocator local_81;
  unsigned_long numItems;
  int actualFormat;
  uchar *data;
  Atom actualType;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_60
  ;
  Atom local_40;
  unsigned_long numBytes;
  
  bVar7 = (anonymous_namespace)::WindowsImplX11Impl::ewmhSupported()::ewmhSupported;
  if ((anonymous_namespace)::WindowsImplX11Impl::ewmhSupported()::checked == '\x01')
  goto LAB_00185b40;
  (anonymous_namespace)::WindowsImplX11Impl::ewmhSupported()::checked = '\x01';
  std::__cxx11::string::string
            ((string *)&local_60,"_NET_SUPPORTING_WM_CHECK",(allocator *)&actualType);
  AVar4 = sf::priv::getAtom((string *)&local_60,true);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,"_NET_SUPPORTED",(allocator *)&actualType);
  AVar5 = sf::priv::getAtom((string *)&local_60,true);
  std::__cxx11::string::~string((string *)&local_60);
  bVar7 = 0;
  if ((AVar4 == 0) || (AVar5 == 0)) goto LAB_00185b40;
  display = sf::priv::OpenDisplay();
  iVar3 = XGetWindowProperty(display,*(undefined8 *)
                                      (*(long *)(display + 0xe8) + 0x10 +
                                      (long)*(int *)(display + 0xe0) * 0x80),AVar4,0,1,0,0x21,
                             (allocator *)&actualType,&actualFormat,&numItems,&numBytes,&data);
  if ((iVar3 == 0) && ((actualType == 0x21 && (numItems == 1)))) {
    lVar1 = *(long *)data;
    XFree();
    if (lVar1 != 0) {
      iVar3 = XGetWindowProperty(display,lVar1,AVar4,0,1,0,0x21,(allocator *)&actualType,
                                 &actualFormat,&numItems,&numBytes,&data);
      if (((iVar3 != 0) || (actualType != 0x21)) || (numItems != 1)) goto LAB_00185b1b;
      lVar2 = *(long *)data;
      XFree();
      if (lVar1 != lVar2 || lVar2 == 0) goto LAB_00185b36;
      (anonymous_namespace)::WindowsImplX11Impl::ewmhSupported()::ewmhSupported = 1;
      std::__cxx11::string::string((string *)&local_60,"_NET_WM_NAME",&local_81);
      AVar4 = sf::priv::getAtom((string *)&local_60,true);
      std::__cxx11::string::~string((string *)&local_60);
      local_40 = AVar4;
      if (AVar4 == 0) {
        bVar7 = 1;
        goto LAB_00185b38;
      }
      std::__cxx11::string::string((string *)&local_60,"UTF8_STRING",&local_81);
      AVar5 = sf::priv::getAtom((string *)&local_60,false);
      std::__cxx11::string::~string((string *)&local_60);
      AVar4 = 0x1f;
      if (AVar5 != 0) {
        AVar4 = AVar5;
      }
      uVar6 = 0;
      iVar3 = XGetWindowProperty(display,lVar1,local_40,0,0x7fffffff,0,AVar4,
                                 (allocator *)&actualType,&actualFormat,&numItems,&numBytes,&data);
      if (actualType != 0 && numItems != 0) {
        sf::String::fromUtf8<char_const*>
                  ((String *)&local_60,(String *)data,(char *)(data + numItems),
                   (char *)CONCAT71((int7)((ulong)uVar6 >> 8),numItems != 0));
        sf::String::operator=
                  ((String *)(anonymous_namespace)::WindowsImplX11Impl::windowManagerName,
                   (String *)&local_60);
        std::__cxx11::
        basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
        ~basic_string(&local_60);
      }
      bVar8 = 1;
      bVar7 = 1;
      goto joined_r0x00185b25;
    }
LAB_00185b36:
    bVar7 = 0;
  }
  else {
LAB_00185b1b:
    bVar8 = 0;
    bVar7 = 0;
joined_r0x00185b25:
    if (iVar3 == 0) {
      XFree(data);
      bVar7 = bVar8;
    }
  }
LAB_00185b38:
  sf::priv::CloseDisplay(display);
LAB_00185b40:
  return (bool)(bVar7 & 1);
}

Assistant:

bool ewmhSupported()
        {
            static bool checked = false;
            static bool ewmhSupported = false;

            if (checked)
                return ewmhSupported;

            checked = true;

            Atom netSupportingWmCheck = sf::priv::getAtom("_NET_SUPPORTING_WM_CHECK", true);
            Atom netSupported = sf::priv::getAtom("_NET_SUPPORTED", true);

            if (!netSupportingWmCheck || !netSupported)
                return false;

            ::Display* display = sf::priv::OpenDisplay();

            Atom actualType;
            int actualFormat;
            unsigned long numItems;
            unsigned long numBytes;
            unsigned char* data;

            int result = XGetWindowProperty(display,
                                            DefaultRootWindow(display),
                                            netSupportingWmCheck,
                                            0,
                                            1,
                                            False,
                                            XA_WINDOW,
                                            &actualType,
                                            &actualFormat,
                                            &numItems,
                                            &numBytes,
                                            &data);

            if (result != Success || actualType != XA_WINDOW || numItems != 1)
            {
                if (result == Success)
                    XFree(data);

                sf::priv::CloseDisplay(display);
                return false;
            }

            #pragma GCC diagnostic push
            #pragma GCC diagnostic ignored "-Wcast-align"
            ::Window rootWindow = *reinterpret_cast< ::Window* >(data);
            #pragma GCC diagnostic pop

            XFree(data);

            if (!rootWindow)
            {
                sf::priv::CloseDisplay(display);
                return false;
            }

            result = XGetWindowProperty(display,
                                        rootWindow,
                                        netSupportingWmCheck,
                                        0,
                                        1,
                                        False,
                                        XA_WINDOW,
                                        &actualType,
                                        &actualFormat,
                                        &numItems,
                                        &numBytes,
                                        &data);

            if (result != Success || actualType != XA_WINDOW || numItems != 1)
            {
                if (result == Success)
                    XFree(data);

                sf::priv::CloseDisplay(display);
                return false;
            }

            #pragma GCC diagnostic push
            #pragma GCC diagnostic ignored "-Wcast-align"
            ::Window childWindow = *reinterpret_cast< ::Window* >(data);
            #pragma GCC diagnostic pop

            XFree(data);

            if (!childWindow)
            {
                sf::priv::CloseDisplay(display);
                return false;
            }

            // Conforming window managers should return the same window for both queries
            if (rootWindow != childWindow)
            {
                sf::priv::CloseDisplay(display);
                return false;
            }

            ewmhSupported = true;

            // We try to get the name of the window manager
            // for window manager specific workarounds
            Atom netWmName = sf::priv::getAtom("_NET_WM_NAME", true);

            if (!netWmName)
            {
                sf::priv::CloseDisplay(display);
                return true;
            }

            Atom utf8StringType = sf::priv::getAtom("UTF8_STRING");

            if (!utf8StringType)
                utf8StringType = XA_STRING;

            result = XGetWindowProperty(display,
                                        rootWindow,
                                        netWmName,
                                        0,
                                        0x7fffffff,
                                        False,
                                        utf8StringType,
                                        &actualType,
                                        &actualFormat,
                                        &numItems,
                                        &numBytes,
                                        &data);

            if (actualType && numItems)
            {
                // It seems the wm name string reply is not necessarily
                // null-terminated. The work around is to get its actual
                // length to build a proper string
                const char* begin = reinterpret_cast<const char*>(data);
                const char* end = begin + numItems;
                windowManagerName = sf::String::fromUtf8(begin, end);
            }

            if (result == Success)
                XFree(data);

            sf::priv::CloseDisplay(display);

            return true;
        }